

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_ternary_Test::TestBody(expr_ternary_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Var *pVVar3;
  char *pcVar4;
  AssertHelper local_b20;
  Message local_b18;
  string local_b10;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar_3;
  Message local_ad8;
  string local_ad0;
  undefined1 local_ab0 [8];
  AssertionResult gtest_ar_2;
  Message local_a98;
  string local_a90;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar_1;
  Message local_a58;
  string local_a50;
  undefined1 local_a30 [8];
  AssertionResult gtest_ar;
  enable_shared_from_this<kratos::Var> local_a10;
  enable_shared_from_this<kratos::Var> local_a00;
  undefined1 local_9f0 [8];
  ConditionalExpr result;
  string local_758;
  Var *local_738;
  Var *b;
  string local_728;
  Var *local_708;
  Var *a;
  string local_6f8;
  Var *local_6d8;
  Var *cond;
  allocator<char> local_6b9;
  string local_6b8;
  undefined1 local_698 [8];
  Generator mod;
  Context c;
  expr_ternary_Test *this_local;
  
  kratos::Context::Context((Context *)&mod.use_stmts_remove_cache_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"mod",&local_6b9);
  pGVar2 = kratos::Context::generator((Context *)&mod.use_stmts_remove_cache_,&local_6b8);
  kratos::Generator::Generator((Generator *)local_698,pGVar2);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"cond",(allocator<char> *)((long)&a + 7));
  pVVar3 = kratos::Generator::var((Generator *)local_698,&local_6f8,1);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a + 7));
  local_6d8 = pVVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"a",(allocator<char> *)((long)&b + 7));
  pVVar3 = kratos::Generator::var((Generator *)local_698,&local_728,1);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  local_708 = pVVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"b",(allocator<char> *)((long)&result.condition + 7));
  pVVar3 = kratos::Generator::var((Generator *)local_698,&local_758,1);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator((allocator<char> *)((long)&result.condition + 7));
  local_738 = pVVar3;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_a00);
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_a10);
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)&gtest_ar.message_);
  kratos::ConditionalExpr::ConditionalExpr
            ((ConditionalExpr *)local_9f0,(shared_ptr<kratos::Var> *)&local_a00,
             (shared_ptr<kratos::Var> *)&local_a10,(shared_ptr<kratos::Var> *)&gtest_ar.message_);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&gtest_ar.message_);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_a10);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_a00);
  kratos::ConditionalExpr::to_string_abi_cxx11_(&local_a50,(ConditionalExpr *)local_9f0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_a30,"result.to_string()","\"cond ? a: b\"",&local_a50,
             (char (*) [12])"cond ? a: b");
  std::__cxx11::string::~string((string *)&local_a50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a30);
  if (!bVar1) {
    testing::Message::Message(&local_a58);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a30);
  kratos::ConditionalExpr::handle_name_abi_cxx11_(&local_a90,(ConditionalExpr *)local_9f0,true);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_a70,"result.handle_name(true)","\"cond ? a: b\"",&local_a90,
             (char (*) [12])"cond ? a: b");
  std::__cxx11::string::~string((string *)&local_a90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar1) {
    testing::Message::Message(&local_a98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  kratos::ConditionalExpr::handle_name_abi_cxx11_(&local_ad0,(ConditionalExpr *)local_9f0,false);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[24],_nullptr>
            ((EqHelper *)local_ab0,"result.handle_name(false)","\"mod.cond ? mod.a: mod.b\"",
             &local_ad0,(char (*) [24])"mod.cond ? mod.a: mod.b");
  std::__cxx11::string::~string((string *)&local_ad0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab0);
  if (!bVar1) {
    testing::Message::Message(&local_ad8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ab0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_ad8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab0);
  kratos::ConditionalExpr::handle_name_abi_cxx11_
            (&local_b10,(ConditionalExpr *)local_9f0,(Generator *)local_698);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_af0,"result.handle_name(&mod)","\"cond ? a: b\"",&local_b10,
             (char (*) [12])"cond ? a: b");
  std::__cxx11::string::~string((string *)&local_b10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
  if (!bVar1) {
    testing::Message::Message(&local_b18);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_af0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xe9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b20,&local_b18);
    testing::internal::AssertHelper::~AssertHelper(&local_b20);
    testing::Message::~Message(&local_b18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
  kratos::ConditionalExpr::~ConditionalExpr((ConditionalExpr *)local_9f0);
  kratos::Generator::~Generator((Generator *)local_698);
  kratos::Context::~Context((Context *)&mod.use_stmts_remove_cache_);
  return;
}

Assistant:

TEST(expr, ternary) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto &cond = mod.var("cond", 1);
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    auto result =
        ConditionalExpr(cond.shared_from_this(), a.shared_from_this(), b.shared_from_this());
    EXPECT_EQ(result.to_string(), "cond ? a: b");
    EXPECT_EQ(result.handle_name(true), "cond ? a: b");
    EXPECT_EQ(result.handle_name(false), "mod.cond ? mod.a: mod.b");
    EXPECT_EQ(result.handle_name(&mod), "cond ? a: b");
}